

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_context.cpp
# Opt level: O0

Node * __thiscall
ccs::TallyBuildContext<ccs::OrTally>::traverse
          (TallyBuildContext<ccs::OrTally> *this,SelectorLeaf *selector)

{
  Node *pNVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  set<std::shared_ptr<ccs::OrTally>,_std::less<std::shared_ptr<ccs::OrTally>_>,_std::allocator<std::shared_ptr<ccs::OrTally>_>_>
  *psVar4;
  iterator __first1;
  iterator __last1;
  iterator __first2;
  iterator __last2;
  iterator __i;
  Tally *this_00;
  __shared_ptr_access<ccs::Tally,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *this_02;
  insert_iterator<std::set<std::shared_ptr<ccs::Tally>,_std::less<std::shared_ptr<ccs::Tally>_>,_std::allocator<std::shared_ptr<ccs::Tally>_>_>_>
  iVar5;
  _Rb_tree_const_iterator<std::shared_ptr<ccs::Tally>_> local_100;
  undefined4 local_f4;
  shared_ptr<ccs::OrTally> local_f0;
  shared_ptr<ccs::OrTally> local_e0;
  undefined1 local_d0 [8];
  shared_ptr<ccs::OrTally> tally;
  undefined1 local_78 [8];
  set<std::shared_ptr<ccs::Tally>,_std::less<std::shared_ptr<ccs::Tally>_>,_std::allocator<std::shared_ptr<ccs::Tally>_>_>
  tallies;
  shared_ptr<ccs::BuildContext> local_38;
  Node *local_28;
  Node *secondNode;
  SelectorLeaf *selector_local;
  TallyBuildContext<ccs::OrTally> *this_local;
  
  secondNode = (Node *)selector;
  selector_local = (SelectorLeaf *)this;
  std::shared_ptr<ccs::BuildContext>::shared_ptr(&local_38,&this->baseContext_);
  iVar3 = (*selector->_vptr_SelectorLeaf[2])(selector,&local_38);
  std::shared_ptr<ccs::BuildContext>::~shared_ptr(&local_38);
  if (this->firstNode_ == (Node *)CONCAT44(extraout_var,iVar3)) {
    this_local = (TallyBuildContext<ccs::OrTally> *)this->firstNode_;
  }
  else {
    local_28 = (Node *)CONCAT44(extraout_var,iVar3);
    std::
    set<std::shared_ptr<ccs::Tally>,_std::less<std::shared_ptr<ccs::Tally>_>,_std::allocator<std::shared_ptr<ccs::Tally>_>_>
    ::set((set<std::shared_ptr<ccs::Tally>,_std::less<std::shared_ptr<ccs::Tally>_>,_std::allocator<std::shared_ptr<ccs::Tally>_>_>
           *)local_78);
    psVar4 = Node::tallies<ccs::OrTally>(this->firstNode_);
    __first1 = std::
               set<std::shared_ptr<ccs::OrTally>,_std::less<std::shared_ptr<ccs::OrTally>_>,_std::allocator<std::shared_ptr<ccs::OrTally>_>_>
               ::begin(psVar4);
    psVar4 = Node::tallies<ccs::OrTally>(this->firstNode_);
    __last1 = std::
              set<std::shared_ptr<ccs::OrTally>,_std::less<std::shared_ptr<ccs::OrTally>_>,_std::allocator<std::shared_ptr<ccs::OrTally>_>_>
              ::end(psVar4);
    psVar4 = Node::tallies<ccs::OrTally>(local_28);
    __first2 = std::
               set<std::shared_ptr<ccs::OrTally>,_std::less<std::shared_ptr<ccs::OrTally>_>,_std::allocator<std::shared_ptr<ccs::OrTally>_>_>
               ::begin(psVar4);
    psVar4 = Node::tallies<ccs::OrTally>(local_28);
    __last2 = std::
              set<std::shared_ptr<ccs::OrTally>,_std::less<std::shared_ptr<ccs::OrTally>_>,_std::allocator<std::shared_ptr<ccs::OrTally>_>_>
              ::end(psVar4);
    __i = std::
          set<std::shared_ptr<ccs::Tally>,_std::less<std::shared_ptr<ccs::Tally>_>,_std::allocator<std::shared_ptr<ccs::Tally>_>_>
          ::end((set<std::shared_ptr<ccs::Tally>,_std::less<std::shared_ptr<ccs::Tally>_>,_std::allocator<std::shared_ptr<ccs::Tally>_>_>
                 *)local_78);
    iVar5 = std::
            inserter<std::set<std::shared_ptr<ccs::Tally>,std::less<std::shared_ptr<ccs::Tally>>,std::allocator<std::shared_ptr<ccs::Tally>>>>
                      ((set<std::shared_ptr<ccs::Tally>,_std::less<std::shared_ptr<ccs::Tally>_>,_std::allocator<std::shared_ptr<ccs::Tally>_>_>
                        *)local_78,__i);
    iVar5 = std::
            set_intersection<std::_Rb_tree_const_iterator<std::shared_ptr<ccs::OrTally>>,std::_Rb_tree_const_iterator<std::shared_ptr<ccs::OrTally>>,std::insert_iterator<std::set<std::shared_ptr<ccs::Tally>,std::less<std::shared_ptr<ccs::Tally>>,std::allocator<std::shared_ptr<ccs::Tally>>>>>
                      ((_Rb_tree_const_iterator<std::shared_ptr<ccs::OrTally>_>)__first1._M_node,
                       (_Rb_tree_const_iterator<std::shared_ptr<ccs::OrTally>_>)__last1._M_node,
                       (_Rb_tree_const_iterator<std::shared_ptr<ccs::OrTally>_>)__first2._M_node,
                       (_Rb_tree_const_iterator<std::shared_ptr<ccs::OrTally>_>)__last2._M_node,
                       iVar5);
    tally.super___shared_ptr<ccs::OrTally,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iVar5.container;
    bVar2 = std::
            set<std::shared_ptr<ccs::Tally>,_std::less<std::shared_ptr<ccs::Tally>_>,_std::allocator<std::shared_ptr<ccs::Tally>_>_>
            ::empty((set<std::shared_ptr<ccs::Tally>,_std::less<std::shared_ptr<ccs::Tally>_>,_std::allocator<std::shared_ptr<ccs::Tally>_>_>
                     *)local_78);
    if (bVar2) {
      std::make_shared<ccs::OrTally,ccs::Node&,ccs::Node&>((Node *)local_d0,this->firstNode_);
      pNVar1 = this->firstNode_;
      std::shared_ptr<ccs::OrTally>::shared_ptr(&local_e0,(shared_ptr<ccs::OrTally> *)local_d0);
      Node::addTally(pNVar1,&local_e0);
      std::shared_ptr<ccs::OrTally>::~shared_ptr(&local_e0);
      pNVar1 = local_28;
      std::shared_ptr<ccs::OrTally>::shared_ptr(&local_f0,(shared_ptr<ccs::OrTally> *)local_d0);
      Node::addTally(pNVar1,&local_f0);
      std::shared_ptr<ccs::OrTally>::~shared_ptr(&local_f0);
      this_00 = &std::__shared_ptr_access<ccs::OrTally,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<ccs::OrTally,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_d0)->super_Tally;
      this_local = (TallyBuildContext<ccs::OrTally> *)Tally::node(this_00);
      local_f4 = 1;
      std::shared_ptr<ccs::OrTally>::~shared_ptr((shared_ptr<ccs::OrTally> *)local_d0);
    }
    else {
      local_100._M_node =
           (_Base_ptr)
           std::
           set<std::shared_ptr<ccs::Tally>,_std::less<std::shared_ptr<ccs::Tally>_>,_std::allocator<std::shared_ptr<ccs::Tally>_>_>
           ::begin((set<std::shared_ptr<ccs::Tally>,_std::less<std::shared_ptr<ccs::Tally>_>,_std::allocator<std::shared_ptr<ccs::Tally>_>_>
                    *)local_78);
      this_01 = (__shared_ptr_access<ccs::Tally,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::_Rb_tree_const_iterator<std::shared_ptr<ccs::Tally>_>::operator*(&local_100);
      this_02 = std::__shared_ptr_access<ccs::Tally,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(this_01);
      this_local = (TallyBuildContext<ccs::OrTally> *)Tally::node(this_02);
      local_f4 = 1;
    }
    std::
    set<std::shared_ptr<ccs::Tally>,_std::less<std::shared_ptr<ccs::Tally>_>,_std::allocator<std::shared_ptr<ccs::Tally>_>_>
    ::~set((set<std::shared_ptr<ccs::Tally>,_std::less<std::shared_ptr<ccs::Tally>_>,_std::allocator<std::shared_ptr<ccs::Tally>_>_>
            *)local_78);
  }
  return (Node *)this_local;
}

Assistant:

virtual Node &traverse(ast::SelectorLeaf &selector) {
    Node &secondNode = selector.traverse(baseContext_);

    // we've arrived at the same node by two different paths. no tally is
    // actually needed here...
    if (&firstNode_ == &secondNode) return firstNode_;

    std::set<std::shared_ptr<Tally>> tallies;

    std::set_intersection(
        firstNode_.tallies<T>().begin(), firstNode_.tallies<T>().end(),
        secondNode.tallies<T>().begin(), secondNode.tallies<T>().end(),
        std::inserter(tallies, tallies.end()));

    // result will be either empty or have exactly one entry.

    if (tallies.empty()) {
      std::shared_ptr<T> tally = std::make_shared<T>(firstNode_,
          secondNode);
      firstNode_.addTally(tally);
      secondNode.addTally(tally);
      return tally->node();
    } else {
      return (*tallies.begin())->node();
    }
  }